

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O3

string_view __thiscall
wabt::anon_unknown_13::NameApplier::FindLabelByVar(NameApplier *this,Var *var)

{
  bool bVar1;
  int iVar2;
  long in_RDX;
  Module *__n;
  uint uVar3;
  long lVar4;
  long lVar5;
  Module **ppMVar6;
  _func_int **__s1;
  string_view sVar7;
  
  if (*(int *)(in_RDX + 0x20) == 0) {
    lVar4 = (long)var - (long)this;
    __n = (Module *)0x0;
    __s1 = (_func_int **)0x0;
    if ((ulong)*(uint *)(in_RDX + 0x28) < (ulong)(lVar4 >> 5)) {
      lVar5 = ~(ulong)*(uint *)(in_RDX + 0x28) * 0x20;
      __s1 = *(_func_int ***)((long)this + lVar5 + lVar4);
      __n = *(Module **)((long)this + lVar5 + 8 + lVar4);
    }
  }
  else {
    if (*(int *)(in_RDX + 0x20) != 1) {
      __assert_fail("is_index()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                    ,0x3b,"Index wabt::Var::index() const");
    }
    uVar3 = (int)((ulong)((long)var - (long)this) >> 5) - 1;
    if (-1 < (int)uVar3) {
      __n = *(Module **)(in_RDX + 0x30);
      ppMVar6 = &this->module_ + (ulong)uVar3 * 4;
      lVar4 = (ulong)uVar3 + 1;
      do {
        if (*ppMVar6 == __n) {
          __s1 = (((NameApplier *)(ppMVar6 + -1))->super_DelegateNop).super_Delegate._vptr_Delegate;
          if (__n == (Module *)0x0) {
            __n = (Module *)0x0;
            goto LAB_0011588f;
          }
          iVar2 = bcmp(__s1,*(void **)(in_RDX + 0x28),(size_t)__n);
          if (iVar2 == 0) goto LAB_0011588f;
        }
        ppMVar6 = ppMVar6 + -4;
        lVar5 = lVar4 + -1;
        bVar1 = 0 < lVar4;
        lVar4 = lVar5;
      } while (lVar5 != 0 && bVar1);
    }
    __n = (Module *)0x0;
    __s1 = (_func_int **)0x0;
  }
LAB_0011588f:
  sVar7._M_str = (char *)__s1;
  sVar7._M_len = (size_t)__n;
  return sVar7;
}

Assistant:

std::string_view NameApplier::FindLabelByVar(Var* var) {
  if (var->is_name()) {
    for (int i = labels_.size() - 1; i >= 0; --i) {
      const std::string& label = labels_[i];
      if (label == var->name()) {
        return label;
      }
    }
    return std::string_view();
  } else {
    if (var->index() >= labels_.size()) {
      return std::string_view();
    }
    return labels_[labels_.size() - 1 - var->index()];
  }
}